

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int collect_remote_banner(LIBSSH2_SESSION *session,size_t banner_len)

{
  ulong uVar1;
  uchar *__dest;
  size_t local_38;
  size_t existing_len;
  size_t total_len;
  uchar *new_banner;
  size_t banner_len_local;
  LIBSSH2_SESSION *session_local;
  
  local_38 = 0;
  if ((session->remote).banner != (uchar *)0x0) {
    local_38 = strlen((char *)(session->remote).banner);
  }
  uVar1 = local_38 + banner_len + 1;
  if (uVar1 < 0x2001) {
    __dest = (uchar *)(*session->alloc)(uVar1,&session->abstract);
    if (__dest == (uchar *)0x0) {
      session_local._4_4_ = _libssh2_error(session,-6,"Error allocating space for remote banner");
    }
    else {
      if (local_38 != 0) {
        memcpy(__dest,(session->remote).banner,local_38);
      }
      memcpy(__dest + local_38,session->banner_TxRx_banner,banner_len);
      __dest[local_38 + banner_len] = '\0';
      if ((session->remote).banner != (uchar *)0x0) {
        (*session->free)((session->remote).banner,&session->abstract);
      }
      (session->remote).banner = __dest;
      session_local._4_4_ = 0;
    }
  }
  else {
    session_local._4_4_ = _libssh2_error(session,-2,"Remote banner line too long");
  }
  return session_local._4_4_;
}

Assistant:

static int collect_remote_banner(LIBSSH2_SESSION * session,
                                 size_t banner_len) {
    /* determine size for existing and more banner and allocate */                                
    unsigned char* new_banner;
    size_t total_len, existing_len = 0;
    if(session->remote.banner) existing_len = strlen((char const*)session->remote.banner);
    total_len = existing_len + banner_len + 1;

    if(total_len > LIBSSH2_SERVER_BANNER_MAX_LINE_LEN) {
        return _libssh2_error(session, LIBSSH2_ERROR_BANNER_RECV,
                              "Remote banner line too long");
    }

    new_banner = LIBSSH2_ALLOC(session, total_len);
    if(!new_banner) {
      return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                            "Error allocating space for remote banner");
    }

    /* combine existing and more banner into a single memory chunk */
    if(existing_len > 0) memcpy(new_banner, session->remote.banner, existing_len);
    memcpy(new_banner + existing_len, session->banner_TxRx_banner, banner_len);
    new_banner[existing_len + banner_len] = '\0';

    if(session->remote.banner)
        LIBSSH2_FREE(session, session->remote.banner);
    session->remote.banner = new_banner;

    return LIBSSH2_ERROR_NONE;
}